

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::IFF_Layer2::AddFundamentalParameterData
          (IFF_Layer2 *this,IFF_ATC_NAVAIDS_FundamentalParameterData *FPD)

{
  KUINT16 *pKVar1;
  
  std::
  vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
  ::push_back(&this->m_vFPD,FPD);
  pKVar1 = &(this->super_LayerHeader).m_ui16LayerLength;
  *pKVar1 = *pKVar1 + 0x18;
  SecondaryOperationalData::SetNumberOfFundamentalParamSets
            (&this->m_SOD,
             (KUINT8)(((long)(this->m_vFPD).
                             super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_vFPD).
                            super__Vector_base<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28));
  return;
}

Assistant:

void IFF_Layer2::AddFundamentalParameterData( const IFF_ATC_NAVAIDS_FundamentalParameterData & FPD )
{
    m_vFPD.push_back( FPD );
    m_ui16LayerLength += IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FUNDAMENTAL_PARAMETER_SIZE;
    m_SOD.SetNumberOfFundamentalParamSets( m_vFPD.size() );
}